

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

bool anon_unknown.dwarf_49603e::EnvironmentHelper
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  String local_50;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *out_local;
  
  local_28 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if ((value != (Value *)0x0) && (bVar1 = Json::Value::isNull(value), !bVar1)) {
    bVar1 = Json::Value::isString((Value *)state_local);
    if (!bVar1) {
      cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
      return false;
    }
    Json::Value::asString_abi_cxx11_(&local_50,(Value *)state_local);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)value_local,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    return true;
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)value_local);
  return true;
}

Assistant:

bool EnvironmentHelper(cm::optional<std::string>& out,
                       const Json::Value* value, cmJSONState* state)
{
  if (!value || value->isNull()) {
    out = cm::nullopt;
    return true;
  }
  if (value->isString()) {
    out = value->asString();
    return true;
  }
  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}